

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_grana_2010.h
# Opt level: O1

void __thiscall BBDT<TTA>::FirstScan(BBDT<TTA> *this)

{
  char cVar1;
  int iVar2;
  int iVar3;
  Mat1b *pMVar4;
  Mat1i *pMVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar2 = *(int *)&pMVar4->field_0x8;
  uVar11 = (ulong)iVar2;
  iVar3 = *(int *)&pMVar4->field_0xc;
  lVar19 = (long)iVar3;
  *TTA::rtable_ = 0;
  TTA::length_ = 1;
  if (0 < (long)uVar11) {
    uVar9 = 0;
    do {
      if (0 < iVar3) {
        pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar12 = **(long **)&pMVar4->field_0x48;
        lVar8 = lVar12 * uVar9 + *(long *)&pMVar4->field_0x10;
        lVar17 = lVar8 - lVar12;
        lVar13 = lVar17 - lVar12;
        lVar12 = lVar12 + lVar8;
        lVar14 = **(long **)&pMVar5->field_0x48;
        lVar16 = lVar14 * uVar9 + *(long *)&pMVar5->field_0x10;
        lVar14 = lVar16 + lVar14 * -2;
        uVar15 = uVar9 | 1;
        uVar18 = 0;
        do {
          if (*(char *)(lVar8 + uVar18) == '\0') {
            if ((uVar15 < uVar11) && (*(char *)(lVar12 + uVar18) != '\0')) {
              uVar7 = uVar18 | 1;
              if (((long)uVar7 < lVar19) && (*(char *)(lVar8 + uVar7) != '\0')) {
                if (uVar18 == 0) {
LAB_00195cad:
                  if ((uVar9 == 0) || (*(char *)(lVar17 + (uVar18 | 1)) == '\0')) {
                    if ((uVar9 != 0) &&
                       (((long)(uVar18 + 2) < lVar19 && (*(char *)(lVar17 + uVar18 + 2) != '\0'))))
                    {
                      if (*(char *)(lVar17 + uVar18) == '\0') goto LAB_00195e52;
                      goto LAB_00195e47;
                    }
                    if ((uVar9 == 0) || (*(char *)(lVar17 + uVar18) == '\0')) goto LAB_00195ed8;
                  }
                  goto LAB_00195e69;
                }
                if (*(char *)((uVar18 - 1) + lVar8) != '\0') {
                  if ((uVar9 == 0) || (*(char *)(lVar17 + uVar7) == '\0')) goto LAB_00195d04;
                  goto LAB_00195c19;
                }
                if (*(char *)(lVar12 + -1 + uVar18) == '\0') goto LAB_00195cad;
                if ((uVar9 != 0) && (*(char *)(lVar17 + uVar7) != '\0')) {
                  if (*(char *)((uVar18 - 2) + lVar8) == '\0') {
                    uVar6 = TTA::Merge(*(uint *)(lVar14 + uVar18 * 4),
                                       *(uint *)(lVar16 + -8 + uVar18 * 4));
                  }
                  else {
                    if (*(char *)(lVar17 + -1 + uVar18) == '\0') goto LAB_001960ac;
                    if (*(char *)(lVar17 + uVar18) == '\0') {
                      cVar1 = *(char *)(lVar13 + uVar18);
                      goto joined_r0x00196291;
                    }
                    uVar6 = *(uint *)(lVar16 + -8 + uVar18 * 4);
                  }
                  *(uint *)(lVar16 + uVar18 * 4) = uVar6;
                  goto LAB_001962a0;
                }
                if (((uVar9 == 0) || (lVar19 <= (long)(uVar18 + 2))) ||
                   (*(char *)(lVar17 + uVar18 + 2) == '\0')) {
                  if ((uVar9 == 0) || (*(char *)(lVar17 + uVar18) == '\0')) goto LAB_00196297;
                  if (*(char *)((uVar18 - 2) + lVar8) == '\0') goto LAB_00196172;
                  if (*(char *)(lVar17 + -1 + uVar18) == '\0') goto LAB_00196052;
LAB_0019606a:
                  uVar6 = *(uint *)(lVar16 + -8 + uVar18 * 4);
                  goto LAB_0019630a;
                }
                if (*(char *)(lVar13 + uVar7) != '\0') {
                  if ((*(char *)((uVar18 - 2) + lVar8) == '\0') ||
                     ((*(char *)(lVar17 + -1 + uVar18) == '\0' &&
                      ((*(char *)(lVar17 + -2 + uVar18) == '\0' ||
                       (*(char *)(lVar13 + -1 + uVar18) == '\0')))))) goto LAB_001962f1;
                  if (*(char *)(lVar17 + uVar18) != '\0') goto LAB_0019606a;
                  cVar1 = *(char *)(lVar13 + uVar18);
joined_r0x00196139:
                  if (cVar1 == '\0') goto LAB_001962d3;
                  goto LAB_00196297;
                }
                if (*(char *)(lVar17 + uVar18) == '\0') goto LAB_001962d3;
                if (*(char *)((uVar18 - 2) + lVar8) == '\0') {
LAB_0019638d:
                  uVar6 = TTA::Merge(*(uint *)(lVar14 + uVar18 * 4),
                                     *(uint *)(lVar14 + 8 + uVar18 * 4));
                  uVar10 = *(uint *)(lVar16 + -8 + uVar18 * 4);
                }
                else {
                  if (*(char *)(lVar17 + -1 + uVar18) == '\0') {
                    if (*(char *)(lVar17 + -2 + uVar18) != '\0') {
                      cVar1 = *(char *)(lVar13 + -1 + uVar18);
                      goto joined_r0x00196353;
                    }
                    goto LAB_0019638d;
                  }
                  uVar6 = *(uint *)(lVar14 + 8 + uVar18 * 4);
                  uVar10 = *(uint *)(lVar16 + -8 + uVar18 * 4);
                }
                uVar6 = TTA::Merge(uVar6,uVar10);
                *(uint *)(lVar16 + uVar18 * 4) = uVar6;
              }
              else {
                if ((uVar18 != 0) &&
                   ((*(char *)((uVar18 - 1) + lVar12) != '\0' ||
                    (*(char *)(lVar8 + -1 + uVar18) != '\0')))) goto LAB_00196297;
LAB_00195ed8:
                TTA::rtable_[TTA::length_] = TTA::length_;
                TTA::next_[TTA::length_] = 0xffffffff;
                TTA::tail_[TTA::length_] = TTA::length_;
                uVar6 = TTA::length_ + 1;
                *(uint *)(lVar16 + uVar18 * 4) = TTA::length_;
                TTA::length_ = uVar6;
              }
            }
            else {
              uVar7 = uVar18 | 1;
              if ((long)uVar7 < lVar19) {
                if (*(char *)(lVar8 + uVar7) != '\0') goto LAB_00195cad;
                if ((uVar15 < uVar11) && (*(char *)(lVar12 + uVar7) != '\0')) goto LAB_00195ed8;
              }
              *(undefined4 *)(lVar16 + uVar18 * 4) = 0;
            }
          }
          else {
            if (uVar18 == 0) {
LAB_00195dd7:
              uVar7 = uVar18 | 1;
              if ((uVar9 == 0) || ((lVar19 <= (long)uVar7 || (*(char *)(lVar17 + uVar7) == '\0'))))
              {
                if (((long)uVar7 < lVar19) &&
                   ((((*(char *)(lVar8 + uVar7) != '\0' && (uVar9 != 0)) &&
                     ((long)(uVar18 + 2) < lVar19)) && (*(char *)(lVar17 + uVar18 + 2) != '\0')))) {
                  if (*(char *)(lVar17 + uVar18) == '\0') {
                    if ((uVar18 != 0) && (*(char *)(lVar17 + -1 + uVar18) != '\0')) {
                      if ((*(char *)(lVar13 + uVar7) == '\0') ||
                         (*(char *)(lVar13 + uVar18) == '\0')) {
                        uVar6 = *(uint *)(lVar14 + -8 + uVar18 * 4);
                        uVar10 = *(uint *)(lVar14 + 8 + uVar18 * 4);
                        goto LAB_001962fb;
                      }
                      uVar6 = *(uint *)(lVar14 + 8 + uVar18 * 4);
                      goto LAB_0019630a;
                    }
                  }
                  else {
LAB_00195e47:
                    if (*(char *)(lVar13 + (uVar18 | 1)) == '\0') {
                      uVar6 = *(uint *)(lVar14 + uVar18 * 4);
                      uVar10 = *(uint *)(lVar14 + 8 + uVar18 * 4);
                      goto LAB_00196089;
                    }
                  }
LAB_00195e52:
                  uVar6 = *(uint *)(lVar14 + 8 + uVar18 * 4);
                }
                else {
                  if ((uVar9 != 0) && (*(char *)(lVar17 + uVar18) != '\0')) goto LAB_00195e69;
                  if ((uVar9 == 0 || uVar18 == 0) || (*(char *)(lVar17 + -1 + uVar18) == '\0'))
                  goto LAB_00195ed8;
                  uVar6 = *(uint *)(lVar14 + -8 + uVar18 * 4);
                }
              }
              else {
                if ((((*(char *)(lVar17 + uVar18) == '\0') && (uVar18 != 0)) &&
                    (*(char *)(lVar17 + -1 + uVar18) != '\0')) &&
                   (*(char *)(lVar13 + uVar18) == '\0')) {
                  uVar6 = *(uint *)(lVar14 + -8 + uVar18 * 4);
                  uVar10 = *(uint *)(lVar14 + uVar18 * 4);
                  goto LAB_00196089;
                }
LAB_00195e69:
                uVar6 = *(uint *)(lVar14 + uVar18 * 4);
              }
            }
            else if (*(char *)(lVar8 + -1 + uVar18) == '\0') {
              if ((uVar11 <= uVar15) || (*(char *)(lVar12 + -1 + uVar18) == '\0'))
              goto LAB_00195dd7;
              uVar7 = uVar18 | 1;
              if (((uVar9 == 0) || (lVar19 <= (long)uVar7)) || (*(char *)(lVar17 + uVar7) == '\0'))
              {
                if (((lVar19 <= (long)uVar7) || (*(char *)(lVar8 + uVar7) == '\0')) ||
                   ((uVar9 == 0 ||
                    ((lVar19 <= (long)(uVar18 + 2) || (*(char *)(lVar17 + uVar18 + 2) == '\0'))))))
                {
                  if (uVar9 != 0) {
                    if (*(char *)(lVar17 + -1 + uVar18) == '\0') {
                      if (*(char *)(lVar17 + uVar18) != '\0') {
                        if (*(char *)((uVar18 - 2) + lVar8) == '\0') goto LAB_00196080;
LAB_00196052:
                        if (*(char *)(lVar17 + -2 + uVar18) == '\0') goto LAB_00196172;
                        goto LAB_0019605e;
                      }
                    }
                    else if (*(char *)((uVar18 - 2) + lVar8) == '\0') {
                      uVar6 = *(uint *)(lVar14 + -8 + uVar18 * 4);
                      goto LAB_00196084;
                    }
                  }
                  goto LAB_00196297;
                }
                if (*(char *)((uVar18 - 2) + lVar8) != '\0') {
                  cVar1 = *(char *)(lVar13 + uVar7);
                  if (*(char *)(lVar17 + -1 + uVar18) == '\0') {
                    if (cVar1 == '\0') {
                      if (*(char *)(lVar17 + uVar18) != '\0') {
                        if (*(char *)(lVar17 + -2 + uVar18) == '\0') {
                          uVar6 = *(uint *)(lVar14 + uVar18 * 4);
                          goto LAB_0019632a;
                        }
                        if (*(char *)(lVar13 + -1 + uVar18) == '\0') goto LAB_00196359;
                        goto LAB_001961ba;
                      }
                    }
                    else if (*(char *)(lVar17 + -2 + uVar18) != '\0') {
                      cVar1 = *(char *)(lVar13 + -1 + uVar18);
                      goto joined_r0x0019620e;
                    }
                  }
                  else {
joined_r0x0019620e:
                    if (cVar1 != '\0') {
                      if (*(char *)(lVar17 + uVar18) == '\0') {
                        cVar1 = *(char *)(lVar13 + uVar18);
                        goto joined_r0x00196139;
                      }
                      goto LAB_00196297;
                    }
                  }
LAB_001962d3:
                  uVar6 = *(uint *)(lVar14 + 8 + uVar18 * 4);
                  goto LAB_00196084;
                }
                if (*(char *)(lVar17 + uVar18) != '\0') {
                  cVar1 = *(char *)(lVar13 + uVar7);
joined_r0x00196353:
                  if (cVar1 != '\0') {
LAB_001961ba:
                    uVar6 = *(uint *)(lVar14 + 8 + uVar18 * 4);
                    goto LAB_001961bf;
                  }
LAB_00196359:
                  uVar6 = *(uint *)(lVar14 + uVar18 * 4);
LAB_0019635d:
                  uVar10 = *(uint *)(lVar14 + 8 + uVar18 * 4);
                  goto LAB_00196362;
                }
                if (*(char *)(lVar17 + -1 + uVar18) == '\0') goto LAB_001962d3;
                if (*(char *)(lVar13 + uVar7) != '\0') {
                  if (*(char *)(lVar13 + uVar18) != '\0') goto LAB_001961ba;
                  uVar6 = *(uint *)(lVar14 + -8 + uVar18 * 4);
                  goto LAB_0019635d;
                }
                uVar6 = *(uint *)(lVar14 + -8 + uVar18 * 4);
LAB_0019632a:
                uVar6 = TTA::Merge(uVar6,*(uint *)(lVar14 + 8 + uVar18 * 4));
                uVar10 = *(uint *)(lVar16 + -8 + uVar18 * 4);
              }
              else {
                if (*(char *)((uVar18 - 2) + lVar8) == '\0') {
                  if ((*(char *)(lVar17 + uVar18) == '\0') &&
                     (*(char *)(lVar17 + -1 + uVar18) != '\0')) {
                    if (*(char *)(lVar13 + uVar18) == '\0') {
                      uVar6 = *(uint *)(lVar14 + -8 + uVar18 * 4);
                      uVar10 = *(uint *)(lVar14 + uVar18 * 4);
LAB_00196362:
                      uVar6 = TTA::Merge(uVar6,uVar10);
                      uVar10 = *(uint *)(lVar16 + -8 + uVar18 * 4);
                    }
                    else {
                      uVar6 = *(uint *)(lVar14 + uVar18 * 4);
LAB_001961bf:
                      uVar10 = *(uint *)(lVar16 + -8 + uVar18 * 4);
                    }
                    uVar6 = TTA::Merge(uVar6,uVar10);
                    *(uint *)(lVar16 + uVar18 * 4) = uVar6;
                    goto LAB_001962a0;
                  }
                }
                else {
                  if (*(char *)(lVar17 + -1 + uVar18) == '\0') {
LAB_001960ac:
                    if ((*(char *)(lVar17 + -2 + uVar18) == '\0') ||
                       (*(char *)(lVar13 + -1 + uVar18) == '\0')) goto LAB_00196172;
                    if (*(char *)(lVar17 + uVar18) != '\0') goto LAB_0019606a;
                    cVar1 = *(char *)(lVar13 + uVar18);
                  }
                  else {
                    if (*(char *)(lVar17 + uVar18) != '\0') goto LAB_00196297;
                    cVar1 = *(char *)(lVar13 + uVar18);
                  }
joined_r0x00196291:
                  if (cVar1 != '\0') goto LAB_00196297;
                }
LAB_00196080:
                uVar6 = *(uint *)(lVar14 + uVar18 * 4);
LAB_00196084:
                uVar10 = *(uint *)(lVar16 + -8 + uVar18 * 4);
              }
LAB_00196089:
              uVar6 = TTA::Merge(uVar6,uVar10);
            }
            else {
              uVar7 = uVar18 | 1;
              if (((uVar9 == 0) || (lVar19 <= (long)uVar7)) || (*(char *)(lVar17 + uVar7) == '\0'))
              {
                if (((long)uVar7 < lVar19) && (*(char *)(lVar8 + uVar7) != '\0')) {
LAB_00195d04:
                  if ((uVar9 != 0) &&
                     (((long)(uVar18 + 2) < lVar19 && (*(char *)(lVar17 + uVar18 + 2) != '\0')))) {
                    if ((*(char *)(lVar13 + (uVar18 | 1)) != '\0') &&
                       ((*(char *)(lVar17 + uVar18) != '\0' ||
                        ((*(char *)(lVar13 + uVar18) != '\0' &&
                         ((*(char *)(lVar17 + -1 + uVar18) != '\0' ||
                          ((*(char *)((uVar18 - 2) + lVar17) != '\0' &&
                           (*(char *)(lVar13 + -1 + uVar18) != '\0')))))))))) goto LAB_0019606a;
LAB_001962f1:
                    uVar6 = *(uint *)(lVar14 + 8 + uVar18 * 4);
                    goto LAB_001962f6;
                  }
                }
              }
              else {
LAB_00195c19:
                if (*(char *)(lVar17 + uVar18) == '\0') {
                  if (*(char *)(lVar13 + uVar18) != '\0') {
                    if (*(char *)(lVar17 + -1 + uVar18) != '\0') goto LAB_0019606a;
                    if (*(char *)((uVar18 - 2) + lVar17) != '\0') {
LAB_0019605e:
                      if (*(char *)(lVar13 + -1 + uVar18) != '\0') goto LAB_0019606a;
                    }
                  }
LAB_00196172:
                  uVar6 = *(uint *)(lVar14 + uVar18 * 4);
LAB_001962f6:
                  uVar10 = *(uint *)(lVar16 + -8 + uVar18 * 4);
LAB_001962fb:
                  uVar6 = TTA::Merge(uVar6,uVar10);
LAB_0019630a:
                  *(uint *)(lVar16 + uVar18 * 4) = uVar6;
                  goto LAB_001962a0;
                }
              }
LAB_00196297:
              uVar6 = *(uint *)(lVar16 + -8 + uVar18 * 4);
            }
            *(uint *)(lVar16 + uVar18 * 4) = uVar6;
          }
LAB_001962a0:
          uVar18 = uVar18 + 2;
        } while ((long)uVar18 < lVar19);
      }
      uVar9 = uVar9 + 2;
    } while ((int)uVar9 < iVar2);
  }
  return;
}

Assistant:

void FirstScan()
    {
        const int h = img_.rows;
        const int w = img_.cols;

        LabelsSolver::Setup(); // Labels solver initialization

        // We work with 2x2 blocks
        // +-+-+-+
        // |P|Q|R|
        // +-+-+-+
        // |S|X|
        // +-+-+

        // The pixels are named as follows
        // +---+---+---+
        // |a b|c d|e f|
        // |g h|i j|k l|
        // +---+---+---+
        // |m n|o p|
        // |q r|s t|
        // +---+---+

        // Pixels a, f, l, q are not needed, since we need to understand the
        // the connectivity between these blocks and those pixels only matter
        // when considering the outer connectivities

        // A bunch of defines used to check if the pixels are foreground,
        // without going outside the image limits.

        // First scan
        for (int r = 0; r < h; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_prev_prev = (unsigned char *)(((char *)img_row_prev) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_prev_prev = (unsigned *)(((char *)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

            for (int c = 0; c < w; c += 2) {

#define CONDITION_B c-1>=0 && r-2>=0 && img_row_prev_prev[c-1]>0
#define CONDITION_C r-2>=0 && img_row_prev_prev[c]>0
#define CONDITION_D c+1<w && r-2>=0 && img_row_prev_prev[c+1]>0
#define CONDITION_E c+2<w && r-2>=0 && img_row_prev_prev[c+2]>0

#define CONDITION_G c-2>=0 && r-1>=0 && img_row_prev[c-2]>0
#define CONDITION_H c-1>=0 && r-1>=0 && img_row_prev[c-1]>0
#define CONDITION_I r-1>=0 && img_row_prev[c]>0
#define CONDITION_J c+1<w && r-1>=0 && img_row_prev[c+1]>0
#define CONDITION_K c+2<w && r-1>=0 && img_row_prev[c+2]>0

#define CONDITION_M c-2>=0 && img_row[c-2]>0
#define CONDITION_N c-1>=0 && img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P c+1<w && img_row[c+1]>0

#define CONDITION_R c-1>=0 && r+1<h && img_row_fol[c-1]>0
#define CONDITION_S r+1<h && img_row_fol[c]>0
#define CONDITION_T c+1<w && r+1<h && img_row_fol[c+1]>0

                // Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; continue; 
                // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); continue; 
                //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2]; continue;
                // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c]; continue;
                // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2]; continue;
                // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; continue; 
                // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]); continue;
                //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]); continue;
                // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]); continue;
                // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]); continue;
                // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]); continue;
                // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]); continue;
                // Action 13: not used
#define ACTION_13 
                // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]); continue;
                //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;
                //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;

#include "labeling_grana_2010_tree.inc.h"
            }
        }

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
    }